

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_push_attributes(CPDecl *decl)

{
  CType *ct;
  CPDecl *decl_local;
  
  if (((decl->stack[decl->pos].info >> 0x1c != 6) && ((decl->attr & 1) != 0)) &&
     ((decl->mode & 8) == 0)) {
    cp_push(decl,0x80020000,decl->attr >> 0x10 & 0xf);
  }
  return;
}

Assistant:

static void cp_push_attributes(CPDecl *decl)
{
  CType *ct = &decl->stack[decl->pos];
  if (ctype_isfunc(ct->info)) {  /* Ok to modify in-place. */
#if LJ_TARGET_X86
    if ((decl->fattr & CTFP_CCONV))
      ct->info = (ct->info & (CTMASK_NUM|CTF_VARARG|CTMASK_CID)) +
		 (decl->fattr & ~CTMASK_CID);
#endif
  } else {
    if ((decl->attr & CTFP_ALIGNED) && !(decl->mode & CPARSE_MODE_FIELD))
      cp_push(decl, CTINFO(CT_ATTRIB, CTATTRIB(CTA_ALIGN)),
	      ctype_align(decl->attr));
  }
}